

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O2

bool __thiscall Regex::parse(Regex *this,string *string)

{
  bool bVar1;
  ParseData data;
  ParseData local_50;
  
  bVar1 = true;
  if (this->mState - STATE_PREPARED < 2) {
    ParseData::ParseData(&local_50,string);
    bVar1 = processSubTree(this,&this->mRoot,&local_50);
    if (bVar1) {
      this->mState = STATE_PARSED;
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return bVar1;
}

Assistant:

bool	Regex::parse( const JHSTD::string &string )
{	
	if ( mState != Regex::STATE_PARSED && mState != Regex::STATE_PREPARED )
		return JetHead::kNotInitialized;
	
	Element *cur_node = &mRoot;
	ParseData data( string );
	
	bool res = processSubTree( cur_node, &data );

	if ( res )
		mState = Regex::STATE_PARSED;

	return res;
}